

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_RDVL(DisasContext_conflict1 *s,arg_RDVL *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  int iVar3;
  TCGv_i64 ret;
  TCGv_i64 reg;
  TCGContext_conflict1 *tcg_ctx;
  arg_RDVL *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    ret = cpu_reg_aarch64(s,a->rd);
    iVar1 = a->imm;
    iVar3 = vec_full_reg_size(s);
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,(long)(iVar1 * iVar3));
  }
  return true;
}

Assistant:

static bool trans_RDVL(DisasContext *s, arg_RDVL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 reg = cpu_reg(s, a->rd);
        tcg_gen_movi_i64(tcg_ctx, reg, a->imm * vec_full_reg_size(s));
    }
    return true;
}